

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  long lVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar2;
  int iVar3;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  bool bVar6;
  int iVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  long lVar9;
  long lVar10;
  undefined7 in_register_00000011;
  Item *pIVar11;
  pointer pnVar12;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  soplex *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  long in_FS_OFFSET;
  byte bVar18;
  int idx;
  uint local_494;
  int local_47c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_478;
  undefined8 uStack_470;
  DataKey local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar18 = 0;
  iVar2 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_3d8.up.m_backend.data._M_elems[0] = 0;
  local_3d8.up.m_backend.data._M_elems[1] = 0xffffffff;
  local_47c = iVar2;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)&local_3d8,row);
  pIVar11 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[iVar2].idx;
  local_494 = 0;
  if (((int)CONCAT71(in_register_00000011,scale) != 0) &&
     (pSVar4 = this->lp_scaler,
     pSVar4 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0)) {
    local_494 = (*pSVar4->_vptr_SPxScaler[1])
                          (pSVar4,pIVar11,
                           &(this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar17 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_478 = *(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.up.m_backend.prec_elem = 0x1c;
    local_3d8.up.m_backend.data._M_elems[0] = 0;
    local_3d8.up.m_backend.data._M_elems[1] = 0;
    local_3d8.up.m_backend.data._M_elems[2] = 0;
    local_3d8.up.m_backend.data._M_elems[3] = 0;
    local_3d8.up.m_backend.data._M_elems[4] = 0;
    local_3d8.up.m_backend.data._M_elems[5] = 0;
    local_3d8.up.m_backend.data._M_elems[6] = 0;
    local_3d8.up.m_backend.data._M_elems[7] = 0;
    local_3d8.up.m_backend.data._M_elems[8] = 0;
    local_3d8.up.m_backend.data._M_elems[9] = 0;
    local_3d8.up.m_backend.data._M_elems[10] = 0;
    local_3d8.up.m_backend.data._M_elems[0xb] = 0;
    local_3d8.up.m_backend.data._M_elems[0xc] = 0;
    local_3d8.up.m_backend.data._M_elems[0xd] = 0;
    local_3d8.up.m_backend.data._M_elems[0xe] = 0;
    local_3d8.up.m_backend.data._M_elems[0xf] = 0;
    local_3d8.up.m_backend.data._M_elems[0x10] = 0;
    local_3d8.up.m_backend.data._M_elems[0x11] = 0;
    local_3d8.up.m_backend.data._M_elems[0x12] = 0;
    local_3d8.up.m_backend.data._M_elems[0x13] = 0;
    local_3d8.up.m_backend.data._M_elems[0x14] = 0;
    local_3d8.up.m_backend.data._M_elems[0x15] = 0;
    local_3d8.up.m_backend.data._M_elems[0x16] = 0;
    local_3d8.up.m_backend.data._M_elems[0x17] = 0;
    local_3d8.up.m_backend.data._M_elems[0x18] = 0;
    local_3d8.up.m_backend.data._M_elems[0x19] = 0;
    local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.up.m_backend.exp = 0;
    local_3d8.up.m_backend.neg = false;
    uStack_470 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)local_478);
    if ((pcVar17->fpclass != cpp_dec_float_NaN) &&
       ((local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN &&
        (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar17,(cpp_dec_float<200U,_int,_void> *)&local_3d8), iVar7 < 0)))) {
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar5 + iVar2;
      psVar15 = local_b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_40 = pnVar5[iVar2].m_backend.exp;
      local_3c = pnVar5[iVar2].m_backend.neg;
      local_38._0_4_ = pnVar5[iVar2].m_backend.fpclass;
      local_38._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_494,(undefined4)local_38);
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar13 = &local_3d8;
      pnVar12 = pnVar5 + iVar2;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
        pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      pnVar5[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
      pnVar5[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
      pnVar5[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
      pnVar5[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    }
    pcVar17 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.up.m_backend.prec_elem = 0x1c;
    local_3d8.up.m_backend.data._M_elems[0] = 0;
    local_3d8.up.m_backend.data._M_elems[1] = 0;
    local_3d8.up.m_backend.data._M_elems[2] = 0;
    local_3d8.up.m_backend.data._M_elems[3] = 0;
    local_3d8.up.m_backend.data._M_elems[4] = 0;
    local_3d8.up.m_backend.data._M_elems[5] = 0;
    local_3d8.up.m_backend.data._M_elems[6] = 0;
    local_3d8.up.m_backend.data._M_elems[7] = 0;
    local_3d8.up.m_backend.data._M_elems[8] = 0;
    local_3d8.up.m_backend.data._M_elems[9] = 0;
    local_3d8.up.m_backend.data._M_elems[10] = 0;
    local_3d8.up.m_backend.data._M_elems[0xb] = 0;
    local_3d8.up.m_backend.data._M_elems[0xc] = 0;
    local_3d8.up.m_backend.data._M_elems[0xd] = 0;
    local_3d8.up.m_backend.data._M_elems[0xe] = 0;
    local_3d8.up.m_backend.data._M_elems[0xf] = 0;
    local_3d8.up.m_backend.data._M_elems[0x10] = 0;
    local_3d8.up.m_backend.data._M_elems[0x11] = 0;
    local_3d8.up.m_backend.data._M_elems[0x12] = 0;
    local_3d8.up.m_backend.data._M_elems[0x13] = 0;
    local_3d8.up.m_backend.data._M_elems[0x14] = 0;
    local_3d8.up.m_backend.data._M_elems[0x15] = 0;
    local_3d8.up.m_backend.data._M_elems[0x16] = 0;
    local_3d8.up.m_backend.data._M_elems[0x17] = 0;
    local_3d8.up.m_backend.data._M_elems[0x18] = 0;
    local_3d8.up.m_backend.data._M_elems[0x19] = 0;
    local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.up.m_backend.exp = 0;
    local_3d8.up.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,-(double)local_478);
    if (((pcVar17->fpclass != cpp_dec_float_NaN) &&
        (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar17,(cpp_dec_float<200U,_int,_void> *)&local_3d8), 0 < iVar7)) {
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar5 + iVar2;
      psVar15 = local_130;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_c0 = pnVar5[iVar2].m_backend.exp;
      local_bc = pnVar5[iVar2].m_backend.neg;
      local_b8._0_4_ = pnVar5[iVar2].m_backend.fpclass;
      local_b8._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_494,(undefined4)local_b8);
      pnVar5 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar13 = &local_3d8;
      pnVar12 = pnVar5 + iVar2;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
        pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      pnVar5[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
      pnVar5[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
      pnVar5[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
      pnVar5[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    }
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = pnVar5 + iVar2;
    psVar15 = local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
    }
    local_140 = pnVar5[iVar2].m_backend.exp;
    local_13c = pnVar5[iVar2].m_backend.neg;
    local_138._0_4_ = pnVar5[iVar2].m_backend.fpclass;
    local_138._4_4_ = pnVar5[iVar2].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_3d8,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_494,(undefined4)local_138);
    pnVar5 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar13 = &local_3d8;
    pnVar12 = pnVar5 + iVar2;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
      pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar5[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
    pnVar5[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
    pnVar5[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
    pnVar5[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar2] = local_494;
  }
  lVar9 = (long)(pIVar11->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
  if (0 < lVar9) {
    this_00 = &this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_478 = this;
    do {
      lVar1 = lVar9 + -1;
      pNVar8 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar2 = pNVar8[lVar9 + -1].idx;
      if (scale) {
        pNVar14 = pNVar8 + lVar1;
        psVar15 = local_230;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined4 *)psVar15 = (pNVar14->val).m_backend.data._M_elems[0];
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
        }
        local_1c0 = pNVar8[lVar1].val.m_backend.exp;
        local_1bc = pNVar8[lVar1].val.m_backend.neg;
        local_1b8._0_4_ = pNVar8[lVar1].val.m_backend.fpclass;
        local_1b8._4_4_ = pNVar8[lVar1].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((local_478->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar2] + local_494),
                   CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
        pNVar8 = (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pLVar13 = &local_3d8;
        pNVar14 = pNVar8 + lVar1;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pNVar14->val).m_backend.data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
          pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar13 + (ulong)bVar18 * -8 + 4);
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        pNVar8[lVar1].val.m_backend.exp = local_3d8.up.m_backend.exp;
        pNVar8[lVar1].val.m_backend.neg = local_3d8.up.m_backend.neg;
        pNVar8[lVar1].val.m_backend.fpclass = local_3d8.up.m_backend.fpclass;
        pNVar8[lVar1].val.m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        pNVar8 = (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        this = local_478;
      }
      pNVar14 = pNVar8 + lVar1;
      pnVar16 = &local_458;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pNVar14->val).m_backend.data._M_elems[0];
        pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_458.m_backend.exp = pNVar8[lVar1].val.m_backend.exp;
      local_458.m_backend.neg = pNVar8[lVar1].val.m_backend.neg;
      local_458.m_backend.fpclass = pNVar8[lVar1].val.m_backend.fpclass;
      local_458.m_backend.prec_elem = pNVar8[lVar1].val.m_backend.prec_elem;
      if ((this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar2) {
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPColBase(&local_3d8,0);
        iVar7 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar7 <= iVar2) {
          iVar7 = (iVar2 - iVar7) + 1;
          do {
            local_460.info = 0;
            local_460.idx = -1;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this_00,&local_460,&local_3d8);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
        this = local_478;
        if (local_3d8.vec.theelem !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_3d8.vec.theelem);
          this = local_478;
        }
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(this_00,iVar2,1,&local_47c,&local_458);
      bVar6 = 1 < lVar9;
      lVar9 = lVar1;
    } while (bVar6);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar3));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }